

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O0

cgltf_float
cgltf_component_read_float(void *in,cgltf_component_type component_type,cgltf_bool normalized)

{
  cgltf_size cVar1;
  float local_2c;
  cgltf_bool normalized_local;
  cgltf_component_type component_type_local;
  void *in_local;
  
  if (component_type == cgltf_component_type_r_32f) {
    in_local._4_4_ = *in;
  }
  else if (normalized == 0) {
    cVar1 = cgltf_component_read_index(in,component_type);
    local_2c = (float)cVar1;
    in_local._4_4_ = local_2c;
  }
  else {
    switch(component_type) {
    case cgltf_component_type_r_8:
      in_local._4_4_ = (float)(int)*in / 127.0;
      break;
    case cgltf_component_type_r_8u:
      in_local._4_4_ = (float)*in / 255.0;
      break;
    case cgltf_component_type_r_16:
      in_local._4_4_ = (float)(int)*in / 32767.0;
      break;
    case cgltf_component_type_r_16u:
      in_local._4_4_ = (float)*in / 65535.0;
      break;
    default:
      in_local._4_4_ = 0.0;
    }
  }
  return in_local._4_4_;
}

Assistant:

static cgltf_float cgltf_component_read_float(const void* in, cgltf_component_type component_type, cgltf_bool normalized)
{
    if (component_type == cgltf_component_type_r_32f)
    {
        return *((const float*) in);
    }

    if (normalized)
    {
        switch (component_type)
        {
            // note: glTF spec doesn't currently define normalized conversions for 32-bit integers
            case cgltf_component_type_r_16:
                return *((const int16_t*) in) / (cgltf_float)32767;
            case cgltf_component_type_r_16u:
                return *((const uint16_t*) in) / (cgltf_float)65535;
            case cgltf_component_type_r_8:
                return *((const int8_t*) in) / (cgltf_float)127;
            case cgltf_component_type_r_8u:
                return *((const uint8_t*) in) / (cgltf_float)255;
            default:
                return 0;
        }
    }

    return (cgltf_float)cgltf_component_read_index(in, component_type);
}